

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterSparseDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol)

{
  uint *puVar1;
  uint uVar2;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  pointer pnVar4;
  int *piVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  int32_t iVar14;
  undefined8 uVar15;
  int iVar16;
  DataKey DVar17;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *tol;
  pointer pnVar18;
  long lVar19;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  uint local_1f0;
  cpp_dec_float<100U,_int,_void> local_1e8;
  cpp_dec_float<100U,_int,_void> *local_190;
  pointer local_188;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_180;
  cpp_dec_float<100U,_int,_void> local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  devexpr local_88 [8];
  uint auStack_80 [2];
  uint local_78 [2];
  uint auStack_70 [2];
  uint local_68 [2];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  int local_48;
  byte local_44;
  fpclass_type local_40;
  int32_t iStack_3c;
  
  pSVar3 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar4 = (pSVar3->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_188 = (pSVar3->coWeights).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_1e8.fpclass = cpp_dec_float_finite;
  local_1e8.prec_elem = 0x10;
  local_1e8.data._M_elems[0] = 0;
  local_1e8.data._M_elems[1] = 0;
  local_1e8.data._M_elems[2] = 0;
  local_1e8.data._M_elems[3] = 0;
  local_1e8.data._M_elems[4] = 0;
  local_1e8.data._M_elems[5] = 0;
  local_1e8.data._M_elems[6] = 0;
  local_1e8.data._M_elems[7] = 0;
  local_1e8.data._M_elems[8] = 0;
  local_1e8.data._M_elems[9] = 0;
  local_1e8.data._M_elems[10] = 0;
  local_1e8.data._M_elems[0xb] = 0;
  local_1e8.data._M_elems[0xc] = 0;
  local_1e8.data._M_elems[0xd] = 0;
  local_1e8.data._M_elems._56_5_ = 0;
  local_1e8.data._M_elems[0xf]._1_3_ = 0;
  local_1e8.exp = 0;
  local_1e8.neg = false;
  lVar19 = (long)(pSVar3->infeasibilities).super_IdxSet.num;
  local_190 = &best->m_backend;
  if (lVar19 < 1) {
    local_1f0 = 0xffffffff;
  }
  else {
    local_180 = &this->last;
    lVar19 = lVar19 + 1;
    local_1f0 = 0xffffffff;
    do {
      uVar2 = (((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->infeasibilities).super_IdxSet.idx[lVar19 + -2];
      tol = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)(ulong)uVar2;
      local_1e8.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[(int)uVar2].m_backend.data;
      local_1e8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar4[(int)uVar2].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar4[(int)uVar2].m_backend.data + 0x10);
      local_1e8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_1e8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar4[(int)uVar2].m_backend.data + 0x20);
      local_1e8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_1e8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar4[(int)uVar2].m_backend.data + 0x30);
      local_1e8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar6 = *(undefined8 *)(puVar1 + 2);
      local_1e8.data._M_elems._56_5_ = SUB85(uVar6,0);
      local_1e8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_1e8.exp = pnVar4[(int)uVar2].m_backend.exp;
      local_1e8.neg = pnVar4[(int)uVar2].m_backend.neg;
      local_1e8.fpclass = pnVar4[(int)uVar2].m_backend.fpclass;
      local_1e8.prec_elem = pnVar4[(int)uVar2].m_backend.prec_elem;
      local_178.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
      local_178.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
      local_178.data._M_elems._16_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
      local_178.data._M_elems._24_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
      local_178.data._M_elems._32_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
      local_178.data._M_elems._40_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 10);
      local_178.data._M_elems._48_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
      local_178.data._M_elems._56_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
      local_178.exp = (feastol->m_backend).exp;
      local_178.neg = (feastol->m_backend).neg;
      local_178.fpclass = (feastol->m_backend).fpclass;
      local_178.prec_elem = (feastol->m_backend).prec_elem;
      if (local_178.data._M_elems[0] != 0 || local_178.fpclass != cpp_dec_float_finite) {
        local_178.neg = (bool)(local_178.neg ^ 1);
      }
      if ((local_178.fpclass == cpp_dec_float_NaN || local_1e8.fpclass == cpp_dec_float_NaN) ||
         (iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&local_1e8,&local_178), -1 < iVar16)) {
        pSVar3 = (this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
        piVar5 = (pSVar3->infeasibilities).super_IdxSet.idx;
        iVar16 = (pSVar3->infeasibilities).super_IdxSet.num;
        (pSVar3->infeasibilities).super_IdxSet.num = iVar16 + -1;
        piVar5[lVar19 + -2] = piVar5[(long)iVar16 + -1];
        (pSVar3->isInfeasible).data[(int)uVar2] = 0;
        uVar15 = local_1e8.data._M_elems._48_8_;
        uVar6 = local_1e8._72_8_;
      }
      else {
        uStack_50 = CONCAT35(local_1e8.data._M_elems[0xf]._1_3_,local_1e8.data._M_elems._56_5_);
        local_88 = (devexpr  [8])local_1e8.data._M_elems._0_8_;
        auStack_80[0] = local_1e8.data._M_elems[2];
        auStack_80[1] = local_1e8.data._M_elems[3];
        local_78[0] = local_1e8.data._M_elems[4];
        local_78[1] = local_1e8.data._M_elems[5];
        auStack_70[0] = local_1e8.data._M_elems[6];
        auStack_70[1] = local_1e8.data._M_elems[7];
        local_68[0] = local_1e8.data._M_elems[8];
        local_68[1] = local_1e8.data._M_elems[9];
        auStack_60[0] = local_1e8.data._M_elems[10];
        auStack_60[1] = local_1e8.data._M_elems[0xb];
        local_58[0] = local_1e8.data._M_elems[0xc];
        local_58[1] = local_1e8.data._M_elems[0xd];
        local_48 = local_1e8.exp;
        local_44 = local_1e8.neg;
        local_40 = local_1e8.fpclass;
        iStack_3c = local_1e8.prec_elem;
        local_d8.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)&local_188[(int)uVar2].m_backend.data;
        local_d8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)&local_188[(int)uVar2].m_backend.data + 8);
        puVar1 = (uint *)((long)&local_188[(int)uVar2].m_backend.data + 0x10);
        local_d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&local_188[(int)uVar2].m_backend.data + 0x20);
        local_d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        local_d8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&local_188[(int)uVar2].m_backend.data + 0x30);
        local_d8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        local_d8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
        local_d8.m_backend.exp = local_188[(int)uVar2].m_backend.exp;
        local_d8.m_backend.neg = local_188[(int)uVar2].m_backend.neg;
        local_d8.m_backend.fpclass = local_188[(int)uVar2].m_backend.fpclass;
        local_d8.m_backend.prec_elem = local_188[(int)uVar2].m_backend.prec_elem;
        local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
        local_128.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
        local_128.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
        local_128.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
        local_128.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
        local_128.m_backend.data._M_elems._40_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 10);
        local_128.m_backend.data._M_elems._48_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
        local_128.m_backend.data._M_elems._56_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
        local_128.m_backend.exp = (feastol->m_backend).exp;
        local_128.m_backend.neg = (feastol->m_backend).neg;
        local_128.m_backend.fpclass = (feastol->m_backend).fpclass;
        local_128.m_backend.prec_elem = (feastol->m_backend).prec_elem;
        devexpr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_178,local_88,&local_d8,&local_128,tol);
        uVar15._0_4_ = local_178.data._M_elems[0xc];
        uVar15._4_4_ = local_178.data._M_elems[0xd];
        local_1e8.data._M_elems[0xc] = local_178.data._M_elems[0xc];
        local_1e8.data._M_elems[0xd] = local_178.data._M_elems[0xd];
        local_1e8.data._M_elems._56_5_ = local_178.data._M_elems._56_5_;
        local_1e8.data._M_elems[0xf]._1_3_ = local_178.data._M_elems[0xf]._1_3_;
        local_1e8.data._M_elems[8] = local_178.data._M_elems[8];
        local_1e8.data._M_elems[9] = local_178.data._M_elems[9];
        local_1e8.data._M_elems[10] = local_178.data._M_elems[10];
        local_1e8.data._M_elems[0xb] = local_178.data._M_elems[0xb];
        local_1e8.data._M_elems[4] = local_178.data._M_elems[4];
        local_1e8.data._M_elems[5] = local_178.data._M_elems[5];
        local_1e8.data._M_elems[6] = local_178.data._M_elems[6];
        local_1e8.data._M_elems[7] = local_178.data._M_elems[7];
        local_1e8.data._M_elems[0] = local_178.data._M_elems[0];
        local_1e8.data._M_elems[1] = local_178.data._M_elems[1];
        local_1e8.data._M_elems[2] = local_178.data._M_elems[2];
        local_1e8.data._M_elems[3] = local_178.data._M_elems[3];
        local_1e8.exp = local_178.exp;
        local_1e8.neg = local_178.neg;
        uVar6._0_4_ = local_178.fpclass;
        uVar6._4_4_ = local_178.prec_elem;
        local_1e8.fpclass = local_178.fpclass;
        local_1e8.prec_elem = local_178.prec_elem;
        if (((local_178.fpclass != cpp_dec_float_NaN) && (local_190->fpclass != cpp_dec_float_NaN))
           && (iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                  (&local_1e8,local_190), uVar15 = local_1e8.data._M_elems._48_8_,
              uVar6 = local_1e8._72_8_, 0 < iVar16)) {
          pnVar18 = local_188 + (int)uVar2;
          *(undefined8 *)
           ((((cpp_dec_float<100U,_int,_void> *)&local_190->data)->data)._M_elems + 0xc) =
               local_1e8.data._M_elems._48_8_;
          *(ulong *)((((cpp_dec_float<100U,_int,_void> *)&local_190->data)->data)._M_elems + 0xe) =
               CONCAT35(local_1e8.data._M_elems[0xf]._1_3_,local_1e8.data._M_elems._56_5_);
          *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&local_190->data)->data)._M_elems + 8)
               = local_1e8.data._M_elems._32_8_;
          *(undefined8 *)
           ((((cpp_dec_float<100U,_int,_void> *)&local_190->data)->data)._M_elems + 10) =
               local_1e8.data._M_elems._40_8_;
          *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&local_190->data)->data)._M_elems + 4)
               = local_1e8.data._M_elems._16_8_;
          *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&local_190->data)->data)._M_elems + 6)
               = local_1e8.data._M_elems._24_8_;
          *(undefined8 *)(((cpp_dec_float<100U,_int,_void> *)&local_190->data)->data)._M_elems =
               local_1e8.data._M_elems._0_8_;
          *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&local_190->data)->data)._M_elems + 2)
               = local_1e8.data._M_elems._8_8_;
          local_190->exp = local_1e8.exp;
          local_190->neg = local_1e8.neg;
          local_190->fpclass = local_1e8.fpclass;
          local_190->prec_elem = local_1e8.prec_elem;
          uVar7 = *(undefined8 *)&(pnVar18->m_backend).data;
          uVar8 = *(undefined8 *)((long)&(pnVar18->m_backend).data + 8);
          uVar9 = *(undefined8 *)((long)&(pnVar18->m_backend).data + 0x10);
          uVar10 = *(undefined8 *)((long)&(pnVar18->m_backend).data + 0x18);
          uVar11 = *(undefined8 *)((long)&(pnVar18->m_backend).data + 0x20);
          uVar12 = *(undefined8 *)((long)&(pnVar18->m_backend).data + 0x28);
          uVar13 = *(undefined8 *)((long)&(pnVar18->m_backend).data + 0x38);
          *(undefined8 *)((local_180->m_backend).data._M_elems + 0xc) =
               *(undefined8 *)((long)&(pnVar18->m_backend).data + 0x30);
          *(undefined8 *)((local_180->m_backend).data._M_elems + 0xe) = uVar13;
          *(undefined8 *)((local_180->m_backend).data._M_elems + 8) = uVar11;
          *(undefined8 *)((local_180->m_backend).data._M_elems + 10) = uVar12;
          *(undefined8 *)((local_180->m_backend).data._M_elems + 4) = uVar9;
          *(undefined8 *)((local_180->m_backend).data._M_elems + 6) = uVar10;
          *(undefined8 *)(local_180->m_backend).data._M_elems = uVar7;
          *(undefined8 *)((local_180->m_backend).data._M_elems + 2) = uVar8;
          (this->last).m_backend.exp = (pnVar18->m_backend).exp;
          (this->last).m_backend.neg = (pnVar18->m_backend).neg;
          iVar14 = (pnVar18->m_backend).prec_elem;
          (this->last).m_backend.fpclass = (pnVar18->m_backend).fpclass;
          (this->last).m_backend.prec_elem = iVar14;
          local_1f0 = uVar2;
        }
      }
      local_1e8._72_8_ = uVar6;
      local_1e8.data._M_elems._48_8_ = uVar15;
      lVar19 = lVar19 + -1;
    } while (1 < lVar19);
  }
  if ((int)local_1f0 < 0) {
    DVar17.info = 0;
    DVar17.idx = -1;
  }
  else {
    DVar17 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::coId((this->
                             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).thesolver,local_1f0);
  }
  return (SPxId)DVar17;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterSparseDim(R& best, R feastol)
{
   const R* cTest = this->thesolver->coTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   int enterIdx = -1;
   int idx;
   R x;

   assert(this->thesolver->coWeights.dim() == this->thesolver->coTest().dim());

   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilities.index(i);
      x = cTest[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, cpen[idx], feastol);

         if(x > best)
         {
            best = x;
            enterIdx = idx;
            last = cpen[idx];
         }
      }
      else
      {
         this->thesolver->infeasibilities.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->coId(enterIdx);

   return SPxId();
}